

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O3

int helics::apps::addUsedPotentialInterfaceTemplates
              (json *potentialCommand,
              vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
              *potentials,string *possibleFed,int logLevel,string *type,Federate *fed)

{
  TemplateMatcher *this;
  value_t vVar1;
  pointer pTVar2;
  pointer pcVar3;
  size_t sVar4;
  json_value jVar5;
  uint uVar6;
  pointer in_RAX;
  reference pvVar7;
  pointer extraout_RAX;
  pointer ptVar8;
  pointer extraout_RAX_00;
  pointer extraout_RAX_01;
  TemplateMatcher *ifaceTemplate;
  pointer pTVar9;
  string_view fmt;
  string_view message;
  format_args args;
  data local_118;
  json *local_108;
  string local_100;
  undefined1 local_e0 [32];
  Federate *local_c0;
  string local_b8;
  key_type local_98;
  undefined1 local_78 [32];
  pointer local_58;
  char *pcStack_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  pointer puStack_40;
  
  pTVar9 = (potentials->
           super__Vector_base<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pTVar2 = (potentials->
           super__Vector_base<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pTVar9 == pTVar2) {
    return (int)in_RAX;
  }
  pcVar3 = (possibleFed->_M_dataplus)._M_p;
  sVar4 = possibleFed->_M_string_length;
  local_108 = potentialCommand;
  local_c0 = fed;
  do {
    if ((pTVar9->federate)._M_len == sVar4) {
      if (sVar4 != 0) {
        uVar6 = bcmp((pTVar9->federate)._M_str,pcVar3,sVar4);
        in_RAX = (pointer)(ulong)uVar6;
        if (uVar6 != 0) goto LAB_001f29e3;
      }
      in_RAX = (pTVar9->usedTemplates).
               super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (in_RAX != (pTVar9->usedTemplates).
                    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_118,(initializer_list_t)ZEXT816(0),false,array);
        pcVar3 = (type->_M_dataplus)._M_p;
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,pcVar3,pcVar3 + type->_M_string_length);
        pvVar7 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 ::operator[](local_108,&local_98);
        vVar1 = (pvVar7->m_data).m_type;
        (pvVar7->m_data).m_type = local_118.m_type;
        jVar5 = (pvVar7->m_data).m_value;
        (pvVar7->m_data).m_value = local_118.m_value;
        local_118.m_type = vVar1;
        local_118.m_value = jVar5;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_118);
        pTVar9 = (potentials->
                 super__Vector_base<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pTVar2 = (potentials->
                 super__Vector_base<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (pTVar9 == pTVar2) {
          return (int)extraout_RAX;
        }
        this = (TemplateMatcher *)(local_78 + 0x10);
        ptVar8 = extraout_RAX;
        break;
      }
    }
LAB_001f29e3:
    pTVar9 = pTVar9 + 1;
    if (pTVar9 == pTVar2) {
      return (int)in_RAX;
    }
  } while( true );
LAB_001f2aad:
  sVar4 = (pTVar9->federate)._M_len;
  if (sVar4 == possibleFed->_M_string_length) {
    if (sVar4 != 0) {
      uVar6 = bcmp((pTVar9->federate)._M_str,(possibleFed->_M_dataplus)._M_p,sVar4);
      ptVar8 = (pointer)(ulong)uVar6;
      if (uVar6 != 0) goto LAB_001f2c31;
    }
    ptVar8 = (pTVar9->usedTemplates).
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (ptVar8 != (pTVar9->usedTemplates).
                  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      local_e0._0_8_ = local_e0 + 0x10;
      pcVar3 = (type->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_e0,pcVar3,pcVar3 + type->_M_string_length);
      pvVar7 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               ::operator[](local_108,(key_type *)local_e0);
      TemplateMatcher::usedInterfaceGeneration_abi_cxx11_(this);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::push_back(pvVar7,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)this);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)this);
      ptVar8 = (pointer)(local_e0 + 0x10);
      if ((pointer)local_e0._0_8_ != ptVar8) {
        operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
        ptVar8 = extraout_RAX_00;
      }
      if (8 < logLevel) {
        TemplateMatcher::usedInterfaceGeneration_abi_cxx11_((TemplateMatcher *)local_78);
        fileops::generateJsonString(&local_b8,(json *)local_78,true);
        local_78._16_8_ = (possibleFed->_M_dataplus)._M_p;
        local_78._24_8_ = possibleFed->_M_string_length;
        local_58 = (type->_M_dataplus)._M_p;
        pcStack_50 = (char *)type->_M_string_length;
        local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_b8._M_dataplus._M_p;
        puStack_40 = (pointer)local_b8._M_string_length;
        fmt.size_ = 0xddd;
        fmt.data_ = (char *)0x19;
        args.field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                       (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)fed;
        args.desc_ = (unsigned_long_long)this;
        ::fmt::v11::vformat_abi_cxx11_(&local_100,(v11 *)"federate {} request {} {}",fmt,args);
        message._M_str = local_100._M_dataplus._M_p;
        message._M_len = local_100._M_string_length;
        Federate::logMessage(local_c0,9,message);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)&local_b8 + 0x10U)) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)local_78);
        ptVar8 = extraout_RAX_01;
      }
    }
  }
LAB_001f2c31:
  pTVar9 = pTVar9 + 1;
  if (pTVar9 == pTVar2) {
    return (int)ptVar8;
  }
  goto LAB_001f2aad;
}

Assistant:

static int addUsedPotentialInterfaceTemplates(nlohmann::json& potentialCommand,
                                              std::vector<TemplateMatcher>& potentials,
                                              const std::string& possibleFed,
                                              int logLevel,
                                              const std::string& type,
                                              Federate* fed)
{
    bool hasInterfaceTemplates{false};
    for (auto& ifaceTemplate : potentials) {
        if (ifaceTemplate.federate != possibleFed) {
            continue;
        }
        if (!ifaceTemplate.isUsed()) {
            continue;
        }
        hasInterfaceTemplates = true;
        break;
    }
    if (hasInterfaceTemplates) {
        potentialCommand[type] = nlohmann::json::array();
        for (auto& ifaceTemplate : potentials) {
            if (ifaceTemplate.federate != possibleFed) {
                continue;
            }
            if (!ifaceTemplate.isUsed()) {
                continue;
            }
            potentialCommand[type].push_back(ifaceTemplate.usedInterfaceGeneration());
            if (logLevel >= HELICS_LOG_LEVEL_CONNECTIONS) {
                fed->logMessage(HELICS_LOG_LEVEL_CONNECTIONS,
                                fmt::format("federate {} request {} {}",
                                            possibleFed,
                                            type,
                                            fileops::generateJsonString(
                                                ifaceTemplate.usedInterfaceGeneration())));
            }
        }
    }
    return 0;
}